

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

int key_type(Filename *filename)

{
  LoadFileStatus LVar1;
  LoadedFile *lf_00;
  int toret;
  LoadedFile *lf;
  Filename *filename_local;
  
  lf_00 = lf_new(0x400);
  LVar1 = lf_load(lf_00,filename);
  if (LVar1 == LF_ERROR) {
    lf_free(lf_00);
    filename_local._4_4_ = 0;
  }
  else {
    filename_local._4_4_ = key_type_s(lf_00->binarysource_);
    lf_free(lf_00);
  }
  return filename_local._4_4_;
}

Assistant:

int key_type(const Filename *filename)
{
    LoadedFile *lf = lf_new(1024);
    if (lf_load(lf, filename) == LF_ERROR) {
        lf_free(lf);
        return SSH_KEYTYPE_UNOPENABLE;
    }

    int toret = key_type_s(BinarySource_UPCAST(lf));
    lf_free(lf);
    return toret;
}